

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O2

PKCS12 * d2i_PKCS12(PKCS12 **a,uchar **in,long len)

{
  PKCS12 *orig_ptr;
  ASN1_INTEGER *pAVar1;
  
  orig_ptr = (PKCS12 *)OPENSSL_malloc(0x10);
  if (orig_ptr != (PKCS12 *)0x0) {
    pAVar1 = (ASN1_INTEGER *)OPENSSL_memdup(*in,len);
    orig_ptr->version = pAVar1;
    if (pAVar1 != (ASN1_INTEGER *)0x0) {
      orig_ptr->mac = (PKCS12_MAC_DATA *)len;
      *in = *in + len;
      if (a == (PKCS12 **)0x0) {
        return orig_ptr;
      }
      PKCS12_free(*a);
      *a = orig_ptr;
      return orig_ptr;
    }
    OPENSSL_free(orig_ptr);
  }
  return (PKCS12 *)0x0;
}

Assistant:

PKCS12 *d2i_PKCS12(PKCS12 **out_p12, const uint8_t **ber_bytes,
                   size_t ber_len) {
  PKCS12 *p12 = reinterpret_cast<PKCS12 *>(OPENSSL_malloc(sizeof(PKCS12)));
  if (!p12) {
    return NULL;
  }

  p12->ber_bytes =
      reinterpret_cast<uint8_t *>(OPENSSL_memdup(*ber_bytes, ber_len));
  if (!p12->ber_bytes) {
    OPENSSL_free(p12);
    return NULL;
  }

  p12->ber_len = ber_len;
  *ber_bytes += ber_len;

  if (out_p12) {
    PKCS12_free(*out_p12);
    *out_p12 = p12;
  }

  return p12;
}